

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZGeoElSide,_10>::Resize
          (TPZManVector<TPZGeoElSide,_10> *this,int64_t newsize,TPZGeoElSide *object)

{
  TPZGeoElSide *pTVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  undefined8 *puVar8;
  long lVar9;
  TPZGeoElSide *pTVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  
  if (newsize < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
    return;
  }
  lVar9 = (this->super_TPZVec<TPZGeoElSide>).fNElements;
  if (lVar9 != newsize) {
    lVar12 = (this->super_TPZVec<TPZGeoElSide>).fNAlloc;
    if (lVar12 < newsize) {
      if ((ulong)newsize < 0xb) {
        pTVar1 = (this->super_TPZVec<TPZGeoElSide>).fStore;
        lVar3 = 0;
        lVar12 = lVar9;
        if (lVar9 < 1) {
          lVar9 = lVar3;
          lVar12 = lVar3;
        }
        while (lVar9 != 0) {
          *(undefined4 *)(&this->field_0x30 + lVar3) = *(undefined4 *)((long)&pTVar1->fSide + lVar3)
          ;
          *(undefined8 *)(&this->field_0x28 + lVar3) =
               *(undefined8 *)((long)&pTVar1->fGeoEl + lVar3);
          lVar3 = lVar3 + 0x18;
          lVar9 = lVar9 + -1;
        }
        puVar8 = (undefined8 *)(&this->field_0x28 + lVar12 * 0x18);
        for (; lVar12 < newsize; lVar12 = lVar12 + 1) {
          *(int *)(puVar8 + 1) = object->fSide;
          *puVar8 = object->fGeoEl;
          puVar8 = puVar8 + 3;
        }
        if (pTVar1 != (TPZGeoElSide *)0x0 && pTVar1 != (TPZGeoElSide *)&this->field_0x20) {
          operator_delete__(&pTVar1[-1].fSide,*(long *)&pTVar1[-1].fSide * 0x18 + 8);
        }
        (this->super_TPZVec<TPZGeoElSide>).fStore = (TPZGeoElSide *)&this->field_0x20;
        (this->super_TPZVec<TPZGeoElSide>).fNElements = newsize;
        (this->super_TPZVec<TPZGeoElSide>).fNAlloc = 10;
      }
      else {
        dVar14 = (double)lVar12 * 1.2;
        uVar11 = (long)dVar14;
        if (dVar14 < (double)newsize) {
          uVar11 = newsize;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar11;
        uVar5 = SUB168(auVar2 * ZEXT816(0x18),0);
        uVar6 = uVar5 + 8;
        if (0xfffffffffffffff7 < uVar5) {
          uVar6 = 0xffffffffffffffff;
        }
        uVar5 = 0xffffffffffffffff;
        if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
          uVar5 = uVar6;
        }
        puVar7 = (ulong *)operator_new__(uVar5);
        *puVar7 = uVar11;
        pTVar1 = (TPZGeoElSide *)(puVar7 + 1);
        if (uVar11 != 0) {
          pTVar10 = pTVar1;
          do {
            (pTVar10->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80
            ;
            pTVar10->fGeoEl = (TPZGeoEl *)0x0;
            pTVar10->fSide = -1;
            pTVar10 = pTVar10 + 1;
          } while (pTVar10 != pTVar1 + uVar11);
        }
        pTVar10 = (this->super_TPZVec<TPZGeoElSide>).fStore;
        lVar12 = 0;
        if (0 < lVar9) {
          lVar12 = lVar9;
        }
        lVar9 = 0x10;
        lVar3 = lVar12;
        while (bVar13 = lVar3 != 0, lVar3 = lVar3 + -1, bVar13) {
          *(undefined4 *)((long)puVar7 + lVar9 + 8) =
               *(undefined4 *)((long)&(pTVar10->super_TPZSavable)._vptr_TPZSavable + lVar9);
          *(undefined8 *)((long)puVar7 + lVar9) = *(undefined8 *)((long)pTVar10 + lVar9 + -8);
          lVar9 = lVar9 + 0x18;
        }
        puVar7 = puVar7 + lVar12 * 3 + 2;
        for (; lVar12 < newsize; lVar12 = lVar12 + 1) {
          *(int *)(puVar7 + 1) = object->fSide;
          *puVar7 = (ulong)object->fGeoEl;
          puVar7 = puVar7 + 3;
        }
        if (pTVar10 != (TPZGeoElSide *)0x0 && pTVar10 != (TPZGeoElSide *)&this->field_0x20) {
          operator_delete__(&pTVar10[-1].fSide,*(long *)&pTVar10[-1].fSide * 0x18 + 8);
        }
        (this->super_TPZVec<TPZGeoElSide>).fStore = pTVar1;
        (this->super_TPZVec<TPZGeoElSide>).fNElements = newsize;
        (this->super_TPZVec<TPZGeoElSide>).fNAlloc = uVar11;
      }
    }
    else {
      lVar12 = lVar9 * 0x18 + 8;
      for (; lVar9 < newsize; lVar9 = lVar9 + 1) {
        pTVar1 = (this->super_TPZVec<TPZGeoElSide>).fStore;
        *(int *)((long)&pTVar1->fGeoEl + lVar12) = object->fSide;
        *(TPZGeoEl **)((long)&(pTVar1->super_TPZSavable)._vptr_TPZSavable + lVar12) = object->fGeoEl
        ;
        lVar12 = lVar12 + 0x18;
      }
      (this->super_TPZVec<TPZGeoElSide>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}